

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::SourceArrayLoader14::begin__param
          (SourceArrayLoader14 *this,param__AttributeData *attributeData)

{
  int iVar1;
  ParserChar *local_28;
  ParserChar *pPStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_28 = attributeData->name;
  pPStack_20 = attributeData->sid;
  local_18 = *(undefined4 *)&attributeData->semantic;
  uStack_14 = *(undefined4 *)((long)&attributeData->semantic + 4);
  uStack_10 = *(undefined4 *)&attributeData->type;
  uStack_c = *(undefined4 *)((long)&attributeData->type + 4);
  iVar1 = (*(this->mLoader->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0x15])(this->mLoader,&local_28);
  return SUB41(iVar1,0);
}

Assistant:

bool SourceArrayLoader14::begin__param( const COLLADASaxFWL14::param__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__param(attributeData));
COLLADASaxFWL::param__AttributeData attrData;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
attrData.semantic = attributeData.semantic;
attrData.type = attributeData.type;
return mLoader->begin__param(attrData);
}